

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

void list_empty(list *list)

{
  list *plVar1;
  list *plVar2;
  list *plVar3;
  
  plVar2 = (list *)list->head;
  while (plVar2 != (list *)0x0) {
    plVar1 = (list *)plVar2->head;
    plVar3 = (list *)plVar2->tail;
    if ((list *)plVar2->tail == (list *)0x0) {
      plVar3 = list;
    }
    plVar3->head = (node *)plVar1;
    plVar3 = plVar1;
    if (plVar1 == (list *)0x0) {
      plVar3 = list;
    }
    plVar3->tail = plVar2->tail;
    plVar2->head = (node *)0x0;
    plVar2->tail = (node *)0x0;
    list->size = list->size - 1;
    plVar2 = plVar1;
  }
  return;
}

Assistant:

void list_empty(struct list *list)
{
        clear_list(list, false);
}